

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int unixDeviceCharacteristics(sqlite3_file *id)

{
  int local_1c;
  int rc;
  unixFile *p;
  sqlite3_file *id_local;
  
  local_1c = 0;
  if (((ulong)id[3].pMethods & 0x10000000000000) != 0) {
    local_1c = 0x1000;
  }
  return local_1c;
}

Assistant:

static int unixDeviceCharacteristics(sqlite3_file *id){
  unixFile *p = (unixFile*)id;
  int rc = 0;
#ifdef __QNXNTO__
  if( p->sectorSize==0 ) unixSectorSize(id);
  rc = p->deviceCharacteristics;
#endif
  if( p->ctrlFlags & UNIXFILE_PSOW ){
    rc |= SQLITE_IOCAP_POWERSAFE_OVERWRITE;
  }
  return rc;
}